

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O3

void __thiscall
cmFilePathChecksum::cmFilePathChecksum(cmFilePathChecksum *this,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *currentSrcDir;
  string *currentBinDir;
  string *projectSrcDir;
  string *projectBinDir;
  long lVar2;
  
  paVar1 = &(this->parentDirs)._M_elems[0].second.field_2;
  lVar2 = 0x100;
  do {
    paVar1[-3]._M_allocated_capacity = (size_type)(paVar1 + -2);
    *(undefined8 *)((long)paVar1 + -0x28) = 0;
    paVar1[-2]._M_local_buf[0] = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar1 + -1))->
    _M_dataplus)._M_p = (pointer)paVar1;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_local_buf[0] = '\0';
    paVar1 = paVar1 + 4;
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  currentSrcDir = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  currentBinDir = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  projectSrcDir = cmMakefile::GetHomeDirectory_abi_cxx11_(makefile);
  projectBinDir = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(makefile);
  setupParentDirs(this,currentSrcDir,currentBinDir,projectSrcDir,projectBinDir);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum(cmMakefile* makefile)
{
  this->setupParentDirs(makefile->GetCurrentSourceDirectory(),
                        makefile->GetCurrentBinaryDirectory(),
                        makefile->GetHomeDirectory(),
                        makefile->GetHomeOutputDirectory());
}